

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

bool __thiscall dg::vr::RelationsAnalyzer::mayOverwrite(RelationsAnalyzer *this,I inst,V address)

{
  V val1;
  bool bVar1;
  VRLocation *pVVar2;
  ValueRelations *graph;
  
  pVVar2 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),inst);
  bVar1 = isSafe(this,inst);
  if (!bVar1) {
    if (inst[0x10] != (Instruction)0x3c) {
      return true;
    }
    val1 = *(V *)(inst + -0x20);
    if ((byte)val1[0x10] < 0x14) {
      return true;
    }
    graph = &pVVar2->relations;
    bVar1 = sameBase(graph,val1,address);
    if (bVar1) {
      return true;
    }
    bVar1 = hasKnownOrigin(graph,val1);
    if ((!bVar1) && (bVar1 = mayHaveAlias(this,graph,address), bVar1)) {
      return true;
    }
    bVar1 = mayHaveAlias(this,graph,val1);
    if (bVar1) {
      bVar1 = hasKnownOrigin(graph,address);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool RelationsAnalyzer::mayOverwrite(I inst, V address) const {
    assert(inst);
    assert(address);

    const ValueRelations &graph = codeGraph.getVRLocation(inst).relations;

    if (isSafe(inst))
        return false;

    if (isDangerous(inst))
        return true;

    const auto *store = llvm::cast<llvm::StoreInst>(inst);
    V memoryPtr = store->getPointerOperand();

    return sameBase(graph, memoryPtr, address) ||
           (!hasKnownOrigin(graph, memoryPtr) &&
            mayHaveAlias(graph, address)) ||
           (mayHaveAlias(graph, memoryPtr) && !hasKnownOrigin(graph, address));
}